

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_create(char *zipname,char **filenames,size_t len)

{
  char *__file;
  mz_bool mVar1;
  int iVar2;
  size_t sVar3;
  char *pArchive_name;
  char *name;
  undefined1 local_138 [2];
  mz_uint16 modes;
  mz_uint32 ext_attributes;
  stat file_stat;
  mz_zip_archive zip_archive;
  size_t i;
  int err;
  size_t len_local;
  char **filenames_local;
  char *zipname_local;
  
  i._4_4_ = 0;
  if ((zipname == (char *)0x0) || (sVar3 = strlen(zipname), sVar3 == 0)) {
    return -0x16;
  }
  memset(file_stat.__glibc_reserved + 2,0,0x70);
  if (&stack0x00000000 == (undefined1 *)0xa8) {
    return -7;
  }
  mVar1 = mz_zip_writer_init_file((mz_zip_archive *)(file_stat.__glibc_reserved + 2),zipname,0);
  if (mVar1 == 0) {
    return -1;
  }
  memset(local_138,0,0x90);
  if (&stack0x00000000 == (undefined1 *)0x138) {
    return -7;
  }
  zip_archive.m_pState = (mz_zip_internal_state *)0x0;
  do {
    if (len <= zip_archive.m_pState) {
LAB_001217c9:
      mz_zip_writer_finalize_archive((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
      mz_zip_writer_end((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
      return i._4_4_;
    }
    __file = filenames[(long)zip_archive.m_pState];
    if (__file == (char *)0x0) {
      i._4_4_ = -2;
      goto LAB_001217c9;
    }
    iVar2 = stat(__file,(stat *)local_138);
    if (iVar2 != 0) {
      i._4_4_ = -0x13;
      goto LAB_001217c9;
    }
    name._2_2_ = (ushort)(uint)file_stat.st_nlink & 0xfff;
    if (((uint)file_stat.st_nlink & 0xf000) == 0x4000) {
      name._2_2_ = name._2_2_ | 0x4000;
    }
    if (((uint)file_stat.st_nlink & 0xf000) == 0x8000) {
      name._2_2_ = name._2_2_ | 0x8000;
    }
    if (((uint)file_stat.st_nlink & 0xf000) == 0xa000) {
      name._2_2_ = name._2_2_ | 0xa000;
    }
    if (((uint)file_stat.st_nlink & 0xf000) == 0x6000) {
      name._2_2_ = name._2_2_ | 0x6000;
    }
    if (((uint)file_stat.st_nlink & 0xf000) == 0x2000) {
      name._2_2_ = name._2_2_ | 0x2000;
    }
    if (((uint)file_stat.st_nlink & 0xf000) == 0x1000) {
      name._2_2_ = name._2_2_ | 0x1000;
    }
    if (((uint)file_stat.st_nlink & 0xf000) == 0xc000) {
      name._2_2_ = name._2_2_ | 0xc000;
    }
    name._4_4_ = (uint)name._2_2_ << 0x10 |
                 (uint)((((uint)file_stat.st_nlink & 0x80) != 0 ^ 0xffU) & 1);
    if (((uint)file_stat.st_nlink & 0xf000) == 0x4000) {
      name._4_4_ = name._4_4_ | 0x10;
    }
    pArchive_name = zip_basename(__file);
    mVar1 = mz_zip_writer_add_file
                      ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pArchive_name,__file,"",0,
                       6,name._4_4_);
    if (mVar1 == 0) {
      i._4_4_ = -0x13;
      goto LAB_001217c9;
    }
    zip_archive.m_pState =
         (mz_zip_internal_state *)((long)&((zip_archive.m_pState)->m_central_dir).m_p + 1);
  } while( true );
}

Assistant:

int zip_create(const char *zipname, const char *filenames[], size_t len) {
  int err = 0;
  size_t i;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint32 ext_attributes = 0;
  mz_uint16 modes;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    return ZIP_EINVZIPNAME;
  }

  // Create a new archive.
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return ZIP_EMEMSET;
  }

  if (!mz_zip_writer_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive writer
    return ZIP_ENOINIT;
  }

  if (!memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT))) {
    return ZIP_EMEMSET;
  }

  for (i = 0; i < len; ++i) {
    const char *name = filenames[i];
    if (!name) {
      err = ZIP_EINVENTNAME;
      break;
    }

    if (MZ_FILE_STAT(name, &file_stat) != 0) {
      // problem getting information - check errno
      err = ZIP_ENOFILE;
      break;
    }

#if defined(_WIN32) || defined(__WIN32__) || defined(DJGPP)
    (void)modes; // unused
#else

    /* Initialize with permission bits--which are not implementation-optional */
    modes = file_stat.st_mode &
            (S_IRWXU | S_IRWXG | S_IRWXO | S_ISUID | S_ISGID | S_ISVTX);
    if (S_ISDIR(file_stat.st_mode))
      modes |= UNX_IFDIR;
    if (S_ISREG(file_stat.st_mode))
      modes |= UNX_IFREG;
    if (S_ISLNK(file_stat.st_mode))
      modes |= UNX_IFLNK;
    if (S_ISBLK(file_stat.st_mode))
      modes |= UNX_IFBLK;
    if (S_ISCHR(file_stat.st_mode))
      modes |= UNX_IFCHR;
    if (S_ISFIFO(file_stat.st_mode))
      modes |= UNX_IFIFO;
    if (S_ISSOCK(file_stat.st_mode))
      modes |= UNX_IFSOCK;
    ext_attributes = (modes << 16) | !(file_stat.st_mode & S_IWUSR);
    if ((file_stat.st_mode & S_IFMT) == S_IFDIR) {
      ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;
    }
#endif

    if (!mz_zip_writer_add_file(&zip_archive, zip_basename(name), name, "", 0,
                                ZIP_DEFAULT_COMPRESSION_LEVEL,
                                ext_attributes)) {
      // Cannot add file to zip_archive
      err = ZIP_ENOFILE;
      break;
    }
  }

  mz_zip_writer_finalize_archive(&zip_archive);
  mz_zip_writer_end(&zip_archive);
  return err;
}